

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O0

void __thiscall
xLearn::LinearScore::calc_grad_sgd
          (LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  pointer pNVar5;
  real_t *prVar6;
  Model *in_RDX;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  *in_RDI;
  float in_XMM0_Da;
  real_t g;
  real_t *wb;
  index_t feat_id;
  real_t gradient;
  const_iterator iter;
  index_t num_feat;
  real_t *w;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_38;
  index_t local_2c;
  real_t *local_28;
  float local_1c;
  Model *local_18;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_28 = Model::GetParameter_w(in_RDX);
  local_2c = Model::GetNumFeature(local_18);
  local_38._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar4 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar4) break;
    in_stack_ffffffffffffff9c = local_1c;
    pNVar5 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_38);
    fVar2 = in_stack_ffffffffffffff9c * pNVar5->feat_val;
    pNVar5 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_38);
    uVar1 = pNVar5->feat_id;
    if (uVar1 < local_2c) {
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_28[uVar1]),
                               ZEXT416(*(uint *)((long)&in_RDI[1]._M_current + 4)),
                               ZEXT416((uint)fVar2));
      auVar3 = vfmadd213ss_fma(ZEXT416(auVar3._0_4_),
                               ZEXT416(*(uint *)&in_RDI[1]._M_current ^ 0x80000000),
                               ZEXT416((uint)local_28[uVar1]));
      local_28[uVar1] = auVar3._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_38);
  }
  prVar6 = Model::GetParameter_b(local_18);
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_1c),
                           ZEXT416(*(uint *)&in_RDI[1]._M_current ^ 0x80000000),
                           ZEXT416((uint)*prVar6));
  *prVar6 = auVar3._0_4_;
  return;
}

Assistant:

void LinearScore::calc_grad_sgd(const SparseRow* row,
                                Model& model,
                                real_t pg,
                                real_t norm) {
  // linear term
  real_t* w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    real_t gradient = pg * iter->feat_val;
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    gradient += regu_lambda_ * w[feat_id];
    w[feat_id] -= (learning_rate_ * gradient);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= learning_rate_ * g;
}